

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>>
          (Random *this,vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> *vec)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t index;
  vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> *vec_local;
  Random *this_local;
  
  bVar1 = std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>::empty(vec);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!vec.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                  ,0x50,
                  "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::UnaryOp>]"
                 );
  }
  sVar3 = std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>::size(vec);
  uVar2 = upTo(this,(uint32_t)sVar3);
  pvVar4 = std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>::operator[](vec,(ulong)uVar2);
  return pvVar4;
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }